

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar14;
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  float n2;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar22 [56];
  undefined1 auVar20 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Bounds2f BVar25;
  Vector3f VVar26;
  Point3f PVar27;
  int local_70;
  float va;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar12 [64];
  undefined1 auVar15 [56];
  undefined1 auVar19 [64];
  undefined1 auVar21 [60];
  
  auVar21 = (undefined1  [60])0x0;
  auVar15 = ZEXT856(0);
  VVar26 = AnimatedTransform::operator()
                     ((AnimatedTransform *)this,(Vector3f)(ZEXT412(0x3f800000) << 0x40),ray->time);
  auVar18._0_4_ = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._4_60_ = auVar21;
  auVar11._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar15;
  uVar5._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar5._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar5;
  auVar24._0_4_ = (float)(undefined4)uVar5 * VVar26.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar24._4_4_ = (float)uVar5._4_4_ * VVar26.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar24._8_4_ = auVar15._0_4_ * 0.0;
  auVar24._12_4_ = auVar15._4_4_ * 0.0;
  auVar24 = vmovshdup_avx(auVar24);
  auVar24 = vfmadd231ss_fma(auVar24,auVar23,auVar11._0_16_);
  fVar9 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar9),auVar18._0_16_);
  if (this->cosTotalWidth < local_68._0_4_) {
    auVar17._0_12_ = ZEXT412(0);
    auVar17._12_4_ = 0;
    uVar7 = vcmpss_avx512f(auVar17,ZEXT416((uint)(this->super_ProjectiveCamera).lensRadius),1);
    bVar8 = (bool)((byte)uVar7 & 1);
    fVar16 = (float)((uint)bVar8 * (int)(this->super_ProjectiveCamera).focalDistance +
                    (uint)!bVar8 * 0x3f800000) / local_68._0_4_;
    uVar4 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
    uVar6 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
    fVar10 = (float)(undefined4)uVar5 * fVar16 + (float)uVar4;
    fVar14 = (float)uVar5._4_4_ * fVar16 + (float)uVar6;
    PVar27.super_Tuple3<pbrt::Point3,_float>.z =
         fVar9 * fVar16 + (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
    PVar27.super_Tuple3<pbrt::Point3,_float>.x = fVar10;
    PVar27.super_Tuple3<pbrt::Point3,_float>.y = fVar14;
    auVar21 = (undefined1  [60])0x0;
    auVar15 = ZEXT856(SUB168(CONCAT412(fVar16 * 0.0 + 0.0,
                                       CONCAT48(fVar16 * 0.0 + 0.0,CONCAT44(fVar14,fVar10))),8));
    PVar27 = AnimatedTransform::ApplyInverse((AnimatedTransform *)this,PVar27,ray->time);
    auVar19._0_4_ = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._4_60_ = auVar21;
    auVar12._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar15;
    FVar1 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][0];
    local_48 = auVar12._0_16_;
    local_58 = vmovshdup_avx(local_48);
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][2]),auVar19._0_16_,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][3]));
    fVar9 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][1];
    FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][2];
    FVar3 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][3];
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_58._0_4_ *
                                            (this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][1])),local_48,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][0]));
    local_70 = 0;
    fVar10 = auVar23._0_4_ + auVar24._0_4_;
    va = fVar10;
    if ((fVar10 == 0.0) && (!NAN(fVar10))) {
      LogFatal<char_const(&)[3],char_const(&)[2],char_const(&)[3],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform.h"
                 ,0x18d,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [3])"wp",
                 (char (*) [2])0x56f16e,(char (*) [3])"wp",&va,(char (*) [2])0x56f16e,&local_70);
    }
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][2]),auVar19._0_16_,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][3]));
    bVar8 = fVar10 == 1.0;
    auVar23 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][0]),local_48,
                              ZEXT416((uint)(local_58._0_4_ *
                                            (this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][1])));
    fVar14 = auVar23._0_4_ + auVar24._0_4_;
    auVar15 = (undefined1  [56])0x0;
    local_38 = ZEXT416((uint)bVar8 * (int)fVar14 + (uint)!bVar8 * (int)(fVar14 / fVar10));
    auVar22 = ZEXT856(0);
    BVar25 = FilmBase::SampleBounds
                       ((FilmBase *)
                        ((this->super_ProjectiveCamera).super_CameraBase.film.
                         super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff
                        ));
    auVar20._0_8_ = BVar25.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar20._8_56_ = auVar22;
    auVar13._0_8_ = BVar25.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar13._8_56_ = auVar15;
    if ((BVar25.pMin.super_Tuple2<pbrt::Point2,_float>.x <= (float)local_38._0_4_) &&
       ((float)local_38._0_4_ <= BVar25.pMax.super_Tuple2<pbrt::Point2,_float>.x)) {
      auVar24 = vfmadd132ss_fma(ZEXT416((uint)FVar1),ZEXT416((uint)(fVar9 * (float)local_58._0_4_)),
                                ZEXT416((uint)local_48._0_4_));
      auVar23 = vfmadd132ss_fma(ZEXT416((uint)auVar19._0_4_),ZEXT416((uint)FVar3),
                                ZEXT416((uint)FVar2));
      fVar9 = auVar24._0_4_ + auVar23._0_4_;
      fVar9 = (float)((uint)bVar8 * (int)fVar9 + (uint)!bVar8 * (int)(fVar9 / fVar10));
      auVar24 = vmovshdup_avx(auVar13._0_16_);
      if ((auVar24._0_4_ <= fVar9) &&
         (auVar24 = vmovshdup_avx(auVar20._0_16_), fVar9 <= auVar24._0_4_)) {
        fVar9 = (this->super_ProjectiveCamera).lensRadius;
        uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar9),ZEXT816(0),4);
        bVar8 = (bool)((byte)uVar7 & 1);
        *pdfPos = (Float)((uint)bVar8 * (int)(1.0 / (fVar9 * fVar9 * 3.1415927)) +
                         (uint)!bVar8 * 0x3f800000);
        *pdfDir = 1.0 / ((float)local_68._0_4_ * (float)local_68._0_4_ * (float)local_68._0_4_ *
                        this->A);
        return;
      }
    }
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}